

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O2

bool Rml::Factory::InstanceElementText(Element *parent,String *in_text)

{
  char c;
  code *pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  ElementPtr this;
  bool bVar4;
  char previous;
  SystemInterface *pSVar5;
  char *pcVar6;
  Context *this_00;
  String *pSVar7;
  bool bVar8;
  size_type sVar9;
  byte bVar10;
  bool inside_brackets;
  bool inside_string;
  UniquePtr<Rml::StreamMemory> stream;
  allocator<char> local_e9;
  String close_tag;
  String text;
  String tag;
  ElementPtr local_78;
  ElementPtr element;
  String open_tag;
  
  if (parent == (Element *)0x0) {
    bVar4 = Assert("RMLUI_ASSERT(parent)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                   ,0x165);
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  pSVar5 = GetSystemInterface();
  if (pSVar5 != (SystemInterface *)0x0) {
    (*pSVar5->_vptr_SystemInterface[3])(pSVar5,&text,in_text);
  }
  bVar4 = ::std::all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char)>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )text._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(text._M_dataplus._M_p + text._M_string_length),StringUtilities::IsWhitespace
                    );
  sVar3 = text._M_string_length;
  _Var2 = text._M_dataplus;
  bVar8 = true;
  if (bVar4) goto LAB_002a0334;
  inside_brackets = false;
  inside_string = false;
  bVar10 = 0;
  bVar4 = false;
  previous = '\0';
  for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
    c = _Var2._M_p[sVar9];
    pcVar6 = XMLParseTools::ParseDataBrackets(&inside_brackets,&inside_string,c,previous);
    if (pcVar6 != (char *)0x0) {
      bVar8 = false;
      Log::Message(LT_WARNING,"Failed to instance text element \'%s\'. %s",text._M_dataplus._M_p,
                   pcVar6);
      goto LAB_002a0334;
    }
    bVar10 = bVar10 | inside_brackets;
    if (inside_brackets == false) {
      bVar4 = (bool)(c == '<' | bVar4);
    }
    previous = c;
  }
  if (bVar4) {
    tag._M_dataplus._M_p = (pointer)(text._M_string_length + 0x20);
    ::std::make_unique<Rml::StreamMemory,unsigned_long>((unsigned_long *)&stream);
    this_00 = Element::GetContext(parent);
    if (this_00 == (Context *)0x0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tag,"body",(allocator<char> *)&open_tag);
    }
    else {
      pSVar7 = Context::GetDocumentsBaseTag_abi_cxx11_(this_00);
      ::std::__cxx11::string::string((string *)&tag,(string *)pSVar7);
    }
    ::std::operator+(&close_tag,"<",&tag);
    ::std::operator+(&open_tag,&close_tag,">");
    ::std::__cxx11::string::~string((string *)&close_tag);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&element,
                     "</",&tag);
    ::std::operator+(&close_tag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&element,
                     ">");
    ::std::__cxx11::string::~string((string *)&element);
    StreamMemory::Write((StreamMemory *)
                        stream._M_t.
                        super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                        .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,
                        open_tag._M_dataplus._M_p,open_tag._M_string_length);
    Stream::Write((Stream *)
                  stream._M_t.
                  super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                  .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,&text);
    StreamMemory::Write((StreamMemory *)
                        stream._M_t.
                        super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                        .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,
                        close_tag._M_dataplus._M_p,close_tag._M_string_length);
    StreamMemory::Seek((StreamMemory *)
                       stream._M_t.
                       super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                       .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,0,0);
    InstanceElementStream
              (parent,(Stream *)
                      stream._M_t.
                      super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                      .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl);
    ::std::__cxx11::string::~string((string *)&close_tag);
    ::std::__cxx11::string::~string((string *)&open_tag);
    ::std::__cxx11::string::~string((string *)&tag);
    ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
              (&stream);
LAB_002a0300:
    bVar8 = true;
  }
  else {
    close_tag._M_dataplus._M_p = (pointer)0x0;
    close_tag._M_string_length = 0;
    close_tag.field_2._M_allocated_capacity = 0;
    if ((bVar10 & 1) != 0) {
      Variant::Variant((Variant *)&tag);
      itlib::
      flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
      ::emplace<char_const(&)[10],Rml::Variant>
                ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  *)&close_tag,(char (*) [10])"data-text",(Variant *)&tag);
      Variant::~Variant((Variant *)&tag);
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tag,"#text",(allocator<char> *)&stream);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&open_tag,"#text",&local_e9);
    InstanceElement((Factory *)&element,parent,&tag,&open_tag,(XMLAttributes *)&close_tag);
    ::std::__cxx11::string::~string((string *)&open_tag);
    ::std::__cxx11::string::~string((string *)&tag);
    this = element;
    if ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)
        element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0) {
      Log::Message(LT_ERROR,"Failed to instance text element \'%s\', instancer returned nullptr.",
                   text._M_dataplus._M_p);
    }
    else {
      if (*(undefined ***)
           element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == &PTR__ElementText_00397bb0)
      {
        StringUtilities::DecodeRml(&tag,&text);
        ::std::__cxx11::string::operator=((string *)&text,(string *)&tag);
        ::std::__cxx11::string::~string((string *)&tag);
        ElementText::SetText
                  ((ElementText *)
                   this._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,&text);
        local_78 = (ElementPtr)
                   (ElementPtr)
                   element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                   _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
        element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
        Element::AppendChild(parent,&local_78,true);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_78);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&element);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)&close_tag);
        goto LAB_002a0300;
      }
      pcVar6 = *(char **)((*(undefined ***)
                            element._M_t.
                            super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)[-1] + 8);
      Log::Message(LT_ERROR,
                   "Failed to instance text element \'%s\'. Found type \'%s\', was expecting a derivative of ElementText."
                   ,text._M_dataplus._M_p,pcVar6 + (*pcVar6 == '*'));
    }
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&element);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)&close_tag);
    bVar8 = false;
  }
LAB_002a0334:
  ::std::__cxx11::string::~string((string *)&text);
  return bVar8;
}

Assistant:

bool Factory::InstanceElementText(Element* parent, const String& in_text)
{
	RMLUI_ASSERT(parent);

	String text;
	if (SystemInterface* system_interface = GetSystemInterface())
		system_interface->TranslateString(text, in_text);

	// If this text node only contains white-space we don't want to construct it.
	const bool only_white_space = std::all_of(text.begin(), text.end(), &StringUtilities::IsWhitespace);
	if (only_white_space)
		return true;

	// See if we need to parse it as RML, and whether the text contains data expressions (curly brackets).
	bool parse_as_rml = false;
	bool has_data_expression = false;

	bool inside_brackets = false;
	bool inside_string = false;
	char previous = 0;
	for (const char c : text)
	{
		const char* error_str = XMLParseTools::ParseDataBrackets(inside_brackets, inside_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to instance text element '%s'. %s", text.c_str(), error_str);
			return false;
		}

		if (inside_brackets)
			has_data_expression = true;
		else if (c == '<')
			parse_as_rml = true;

		previous = c;
	}

	// If the text contains RML elements then run it through the XML parser again.
	if (parse_as_rml)
	{
		RMLUI_ZoneScopedNC("InstanceStream", 0xDC143C);
		auto stream = MakeUnique<StreamMemory>(text.size() + 32);
		Context* context = parent->GetContext();
		String tag = context ? context->GetDocumentsBaseTag() : "body";
		String open_tag = "<" + tag + ">";
		String close_tag = "</" + tag + ">";
		stream->Write(open_tag.c_str(), open_tag.size());
		stream->Write(text);
		stream->Write(close_tag.c_str(), close_tag.size());
		stream->Seek(0, SEEK_SET);

		InstanceElementStream(parent, stream.get());
	}
	else
	{
		RMLUI_ZoneScopedNC("InstanceText", 0x8FBC8F);

		// Attempt to instance the element.
		XMLAttributes attributes;

		// If we have curly brackets in the text, we tag the element so that the appropriate data view (DataViewText) is constructed.
		if (has_data_expression)
			attributes.emplace("data-text", Variant());

		ElementPtr element = Factory::InstanceElement(parent, "#text", "#text", attributes);
		if (!element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s', instancer returned nullptr.", text.c_str());
			return false;
		}

		// Assign the element its text value.
		ElementText* text_element = rmlui_dynamic_cast<ElementText*>(element.get());
		if (!text_element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s'. Found type '%s', was expecting a derivative of ElementText.",
				text.c_str(), rmlui_type_name(*element));
			return false;
		}

		// Unescape any escaped entities or unicode symbols
		text = StringUtilities::DecodeRml(text);

		text_element->SetText(text);

		// Add to active node.
		parent->AppendChild(std::move(element));
	}

	return true;
}